

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

bool P_LerpCalculate(AActor *pmo,PredictPos *from,PredictPos *to,PredictPos *result,float scale)

{
  float fVar1;
  double dVar2;
  bool local_f1;
  TVector3<double> local_f0;
  DVector3 local_d8;
  undefined1 local_c0 [8];
  DVector3 delta;
  TVector3<double> local_90;
  undefined1 local_78 [8];
  DVector3 vecResult;
  DVector3 vecTo;
  DVector3 vecFrom;
  float scale_local;
  PredictPos *result_local;
  PredictPos *to_local;
  PredictPos *from_local;
  AActor *pmo_local;
  
  TVector3<double>::TVector3((TVector3<double> *)&vecTo.Z,&from->pos);
  TVector3<double>::TVector3((TVector3<double> *)&vecResult.Z,&to->pos);
  TVector3<double>::TVector3((TVector3<double> *)local_78);
  TVector3<double>::operator-
            (&local_90,(TVector3<double> *)&vecResult.Z,(TVector3<double> *)&vecTo.Z);
  TVector3<double>::operator=((TVector3<double> *)local_78,&local_90);
  TVector3<double>::operator*=((TVector3<double> *)local_78,(double)scale);
  TVector3<double>::operator+
            ((TVector3<double> *)&delta.Z,(TVector3<double> *)local_78,(TVector3<double> *)&vecTo.Z)
  ;
  TVector3<double>::operator=((TVector3<double> *)local_78,(TVector3<double> *)&delta.Z);
  TVector3<double>::operator-
            ((TVector3<double> *)local_c0,(TVector3<double> *)local_78,
             (TVector3<double> *)&vecResult.Z);
  TVector3<double>::operator-(&local_f0,(TVector3<double> *)local_78,&to->pos);
  AActor::Vec3Offset(&local_d8,pmo,&local_f0,false);
  TVector3<double>::operator=(&result->pos,&local_d8);
  dVar2 = TVector3<double>::LengthSquared((TVector3<double> *)local_c0);
  fVar1 = FFloatCVar::operator_cast_to_float(&cl_predict_lerpthreshold);
  local_f1 = (double)fVar1 < dVar2 && scale <= 1.0;
  return local_f1;
}

Assistant:

bool P_LerpCalculate(AActor *pmo, PredictPos from, PredictPos to, PredictPos &result, float scale)
{
	//DVector2 pfrom = Displacements.getOffset(from.portalgroup, to.portalgroup);
	DVector3 vecFrom = from.pos;
	DVector3 vecTo = to.pos;
	DVector3 vecResult;
	vecResult = vecTo - vecFrom;
	vecResult *= scale;
	vecResult = vecResult + vecFrom;
	DVector3 delta = vecResult - vecTo;

	result.pos = pmo->Vec3Offset(vecResult - to.pos);
	//result.portalgroup = P_PointInSector(result.pos.x, result.pos.y)->PortalGroup;

	// As a fail safe, assume extrapolation is the threshold.
	return (delta.LengthSquared() > cl_predict_lerpthreshold && scale <= 1.00f);
}